

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_tools.h
# Opt level: O0

Matrix<double,_3,_3> *
math::matrix_inverse<double>
          (Matrix<double,_3,_3> *__return_storage_ptr__,Matrix<double,_3,_3> *m,double *det)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  undefined1 local_68 [8];
  Matrix<double,_3,_3> ret;
  double *det_local;
  Matrix<double,_3,_3> *m_local;
  
  ret.m[8] = (double)det;
  Matrix<double,_3,_3>::Matrix((Matrix<double,_3,_3> *)local_68);
  pdVar5 = Matrix<double,_3,_3>::operator[](m,4);
  dVar1 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[](m,8);
  dVar2 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[](m,5);
  dVar3 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[](m,7);
  dVar4 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)local_68,0);
  *pdVar5 = dVar1 * dVar2 + -(dVar3 * dVar4);
  pdVar5 = Matrix<double,_3,_3>::operator[](m,2);
  dVar1 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[](m,7);
  dVar2 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[](m,1);
  dVar3 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[](m,8);
  dVar4 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)local_68,1);
  *pdVar5 = dVar1 * dVar2 + -(dVar3 * dVar4);
  pdVar5 = Matrix<double,_3,_3>::operator[](m,1);
  dVar1 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[](m,5);
  dVar2 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[](m,2);
  dVar3 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[](m,4);
  dVar4 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)local_68,2);
  *pdVar5 = dVar1 * dVar2 + -(dVar3 * dVar4);
  pdVar5 = Matrix<double,_3,_3>::operator[](m,5);
  dVar1 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[](m,6);
  dVar2 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[](m,3);
  dVar3 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[](m,8);
  dVar4 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)local_68,3);
  *pdVar5 = dVar1 * dVar2 + -(dVar3 * dVar4);
  pdVar5 = Matrix<double,_3,_3>::operator[](m,0);
  dVar1 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[](m,8);
  dVar2 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[](m,2);
  dVar3 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[](m,6);
  dVar4 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)local_68,4);
  *pdVar5 = dVar1 * dVar2 + -(dVar3 * dVar4);
  pdVar5 = Matrix<double,_3,_3>::operator[](m,2);
  dVar1 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[](m,3);
  dVar2 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[](m,0);
  dVar3 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[](m,5);
  dVar4 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)local_68,5);
  *pdVar5 = dVar1 * dVar2 + -(dVar3 * dVar4);
  pdVar5 = Matrix<double,_3,_3>::operator[](m,3);
  dVar1 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[](m,7);
  dVar2 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[](m,4);
  dVar3 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[](m,6);
  dVar4 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)local_68,6);
  *pdVar5 = dVar1 * dVar2 + -(dVar3 * dVar4);
  pdVar5 = Matrix<double,_3,_3>::operator[](m,1);
  dVar1 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[](m,6);
  dVar2 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[](m,0);
  dVar3 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[](m,7);
  dVar4 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)local_68,7);
  *pdVar5 = dVar1 * dVar2 + -(dVar3 * dVar4);
  pdVar5 = Matrix<double,_3,_3>::operator[](m,0);
  dVar1 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[](m,4);
  dVar2 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[](m,1);
  dVar3 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[](m,3);
  dVar4 = *pdVar5;
  pdVar5 = Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)local_68,8);
  *pdVar5 = dVar1 * dVar2 + -(dVar3 * dVar4);
  Matrix<double,_3,_3>::operator/
            (__return_storage_ptr__,(Matrix<double,_3,_3> *)local_68,(double *)ret.m[8]);
  return __return_storage_ptr__;
}

Assistant:

Matrix<T,3,3>
matrix_inverse (Matrix<T,3,3> const& m, T const& det)
{
    Matrix<T,3,3> ret;
    ret[0] = m[4] * m[8] - m[5] * m[7];
    ret[1] = m[2] * m[7] - m[1] * m[8];
    ret[2] = m[1] * m[5] - m[2] * m[4];
    ret[3] = m[5] * m[6] - m[3] * m[8];
    ret[4] = m[0] * m[8] - m[2] * m[6];
    ret[5] = m[2] * m[3] - m[0] * m[5];
    ret[6] = m[3] * m[7] - m[4] * m[6];
    ret[7] = m[1] * m[6] - m[0] * m[7];
    ret[8] = m[0] * m[4] - m[1] * m[3];
    return ret / det;
}